

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O0

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
::reorder_sa_to_isa(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                    *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *SA)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  MPI_Comm comm;
  reference puVar6;
  reference pvVar7;
  reference pvVar8;
  unsigned_long uVar9;
  value_type vVar10;
  allocator local_1c9;
  string local_1c8;
  ulong local_1a8;
  size_t i_2;
  size_t global_offset;
  unsigned_long out_idx;
  size_t i_1;
  string local_180;
  undefined1 local_160 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_B;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_SA;
  string local_128;
  int local_104;
  value_type vStack_100;
  int target_p_1;
  size_t i;
  undefined1 local_f0 [4];
  int cur_p;
  vector<unsigned_long,_std::allocator<unsigned_long>_> upper_bound;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  int target_p;
  unsigned_long sa;
  iterator __end0;
  iterator __begin0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  allocator<unsigned_long> local_81;
  value_type_conflict1 local_80;
  undefined1 local_78 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  section_timer timer;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *SA_local;
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
  *this_local;
  
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(SA);
  sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->local_B);
  if (sVar4 != sVar5) {
    __assert_fail("SA.size() == local_B.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                  ,0x4fe,
                  "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::reorder_sa_to_isa(std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                 );
  }
  comm = mxx::comm::operator_cast_to_ompi_communicator_t_(&this->comm);
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
  section_timer_impl((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
                     &send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(ostream *)&std::cerr,comm,0
                    );
  iVar3 = this->p;
  local_80 = 0;
  std::allocator<unsigned_long>::allocator(&local_81);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78,(long)iVar3,&local_80
             ,&local_81);
  std::allocator<unsigned_long>::~allocator(&local_81);
  __end0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(SA);
  sa = (unsigned_long)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(SA);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)&sa), bVar2) {
    puVar6 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end0);
    iVar3 = mxx::partition::block_decomposition_buffered<unsigned_long>::target_processor
                      (&this->part,*puVar6);
    bVar2 = false;
    if (-1 < iVar3) {
      bVar2 = iVar3 < this->p;
    }
    if (!bVar2) {
      __assert_fail("0 <= target_p && target_p < p",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                    ,0x507,
                    "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::reorder_sa_to_isa(std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                   );
    }
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78,
                        (long)iVar3);
    *pvVar7 = *pvVar7 + 1;
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end0);
  }
  mxx::local_exscan<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &upper_bound.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78);
  mxx::local_scan<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78);
  i._4_4_ = 0;
  vStack_100 = 0;
  while (uVar1 = vStack_100,
        sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(SA), uVar1 < sVar4)
  {
    while( true ) {
      bVar2 = false;
      if (i._4_4_ < this->p + -1) {
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            &upper_bound.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(long)i._4_4_);
        uVar1 = *pvVar7;
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0,
                            (long)i._4_4_);
        bVar2 = *pvVar7 <= uVar1;
      }
      if (!bVar2) break;
      i._4_4_ = i._4_4_ + 1;
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &upper_bound.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,(long)i._4_4_);
      vStack_100 = *pvVar7;
    }
    if (this->p + -1 <= i._4_4_) break;
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](SA,vStack_100);
    local_104 = mxx::partition::block_decomposition_buffered<unsigned_long>::target_processor
                          (&this->part,*pvVar7);
    if (this->p <= local_104 || local_104 < 0) {
      __assert_fail("target_p < p && target_p >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                    ,0x51a,
                    "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::reorder_sa_to_isa(std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                   );
    }
    if (local_104 == i._4_4_) {
      vStack_100 = vStack_100 + 1;
    }
    else {
      if (local_104 <= i._4_4_) {
        __assert_fail("target_p > cur_p",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x520,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::reorder_sa_to_isa(std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
                     );
      }
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](SA,vStack_100)
      ;
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &upper_bound.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,(long)local_104);
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](SA,*pvVar8);
      std::swap<unsigned_long>(pvVar7,pvVar8);
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->local_B,vStack_100);
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &upper_bound.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,(long)local_104);
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->local_B,*pvVar8);
      std::swap<unsigned_long>(pvVar7,pvVar8);
    }
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &upper_bound.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)local_104);
    *pvVar7 = *pvVar7 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_128,"sa2isa_bucketing",
             (allocator *)
             ((long)&recv_SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
            ((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
             &send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&recv_SA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  mxx::all2allv<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &recv_B.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,SA,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78,&this->comm);
  mxx::all2allv<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_160,&this->local_B,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78,&this->comm);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"sa2isa_all2all",(allocator *)((long)&i_1 + 7));
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
            ((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
             &send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
  out_idx = 0;
  while( true ) {
    uVar9 = out_idx;
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(SA);
    if (sVar4 <= uVar9) {
      i_2 = mxx::partition::block_decomposition_buffered<unsigned_long>::excl_prefix_size
                      (&this->part);
      for (local_1a8 = 0; uVar1 = local_1a8,
          sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(SA),
          uVar1 < sVar4; local_1a8 = local_1a8 + 1) {
        vVar10 = i_2 + local_1a8;
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (SA,local_1a8);
        *pvVar7 = vVar10;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1c8,"sa2isa_rearrange",&local_1c9);
      mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                ((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
                 &send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_160);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &recv_B.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &upper_bound.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78);
      mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
      ~section_timer_impl((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>
                           *)&send_counts.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
      return;
    }
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &recv_B.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,out_idx);
    vVar10 = *pvVar7;
    uVar9 = mxx::partition::block_decomposition_buffered<unsigned_long>::excl_prefix_size
                      (&this->part);
    global_offset = vVar10 - uVar9;
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &recv_B.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar4 <= vVar10 - uVar9) break;
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_160,out_idx);
    vVar10 = *pvVar7;
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->local_B,global_offset);
    *pvVar7 = vVar10;
    out_idx = out_idx + 1;
  }
  __assert_fail("0 <= out_idx && out_idx < recv_SA.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                ,0x531,
                "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>>::reorder_sa_to_isa(std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = false]"
               );
}

Assistant:

void reorder_sa_to_isa(std::vector<index_t>& SA) {
    assert(SA.size() == local_B.size());

    SAC_TIMER_START();
    // 1.) local bucketing for each processor
    //
    // counting the number of elements for each processor
    std::vector<size_t> send_counts(p, 0);
    for (index_t sa : SA) {
        int target_p = part.target_processor(sa);
        assert(0 <= target_p && target_p < p);
        ++send_counts[target_p];
    }
    // get exclusive prefix sum
    std::vector<size_t> send_displs = mxx::local_exscan(send_counts);
    std::vector<size_t> upper_bound = mxx::local_scan(send_counts);

    // in-place bucketing
    int cur_p = 0;
    for (std::size_t i = 0; i < SA.size();) {
        // skip full buckets
        while (cur_p < p-1 && send_displs[cur_p] >= upper_bound[cur_p]) {
            // skip over full buckets
            i = send_displs[++cur_p];
        }
        // break if all buckets are done
        if (cur_p >= p-1)
            break;
        int target_p = part.target_processor(SA[i]);
        assert(target_p < p && target_p >= 0);
        if (target_p == cur_p) {
            // item correctly placed
            ++i;
        } else {
            // swap to correct bucket
            assert(target_p > cur_p);
            std::swap(SA[i], SA[send_displs[target_p]]);
            std::swap(local_B[i], local_B[send_displs[target_p]]);
        }
        send_displs[target_p]++;
    }

    SAC_TIMER_END_SECTION("sa2isa_bucketing");

    // get displacements again (since they were modified above)
    std::vector<index_t> recv_SA = mxx::all2allv(SA, send_counts, comm);
    std::vector<index_t> recv_B = mxx::all2allv(local_B, send_counts, comm);
    SAC_TIMER_END_SECTION("sa2isa_all2all");

    // rearrange locally
    for (std::size_t i = 0; i < SA.size(); ++i) {
        index_t out_idx = recv_SA[i] - part.excl_prefix_size();
        assert(0 <= out_idx && out_idx < recv_SA.size());
        local_B[out_idx] = recv_B[i];
    }

    // reassign the SA
    std::size_t global_offset = part.excl_prefix_size();
    for (std::size_t i = 0; i < SA.size(); ++i) {
        SA[i] = global_offset + i;
    }
    SAC_TIMER_END_SECTION("sa2isa_rearrange");
}